

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O2

REF_STATUS ref_grid_parse_coordinate_system(REF_GRID ref_grid,char *coordinate_system)

{
  int iVar1;
  REF_GRID_COORDSYS RVar2;
  REF_GRID_COORDSYS RVar3;
  
  ref_grid->coordinate_system = REF_GRID_COORDSYS_LAST;
  iVar1 = strcmp("xByUzL",coordinate_system);
  RVar3 = (uint)(iVar1 != 0) * 2 + REF_GRID_XBYUZL;
  ref_grid->coordinate_system = RVar3;
  iVar1 = strcmp("xByRzU",coordinate_system);
  if (iVar1 == 0) {
    RVar3 = REF_GRID_XBYRZU;
  }
  ref_grid->coordinate_system = RVar3;
  iVar1 = strcmp("xFyRzD",coordinate_system);
  RVar2 = REF_GRID_XFYRZD;
  if (iVar1 != 0) {
    RVar2 = RVar3;
  }
  ref_grid->coordinate_system = RVar2;
  if (RVar2 == REF_GRID_COORDSYS_LAST) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0xe4,
           "ref_grid_parse_coordinate_system","coordinate_system not recognized");
  }
  return (uint)(RVar2 == REF_GRID_COORDSYS_LAST);
}

Assistant:

REF_FCN REF_STATUS ref_grid_parse_coordinate_system(
    REF_GRID ref_grid, const char *coordinate_system) {
  ref_grid_coordinate_system(ref_grid) = REF_GRID_COORDSYS_LAST;
  if (0 == strcmp("xByUzL", coordinate_system))
    ref_grid_coordinate_system(ref_grid) = REF_GRID_XBYUZL;
  if (0 == strcmp("xByRzU", coordinate_system))
    ref_grid_coordinate_system(ref_grid) = REF_GRID_XBYRZU;
  if (0 == strcmp("xFyRzD", coordinate_system))
    ref_grid_coordinate_system(ref_grid) = REF_GRID_XFYRZD;
  RUS(REF_GRID_COORDSYS_LAST, ref_grid_coordinate_system(ref_grid),
      "coordinate_system not recognized");
  return REF_SUCCESS;
}